

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

void printInDevices(void)

{
  long lVar1;
  int iVar2;
  long *in_RAX;
  void *__ptr;
  void *__ptr_00;
  ssize_t sVar3;
  char in_CL;
  int extraout_EDX;
  char *pcVar4;
  long *plVar5;
  char *pcVar6;
  uint uVar7;
  char **hints;
  long *local_38;
  
  pcVar6 = "pcm";
  pcVar4 = (char *)0x0;
  local_38 = in_RAX;
  iVar2 = snd_device_name_hint(0,"pcm",&local_38);
  if (iVar2 == 0) {
    lVar1 = *local_38;
    plVar5 = local_38;
    do {
      if (lVar1 == 0) {
        snd_device_name_free_hint(local_38);
        snd_config_update_free_global();
        return;
      }
      __ptr = (void *)snd_device_name_get_hint(lVar1,"NAME");
      __ptr_00 = (void *)snd_device_name_get_hint(*plVar5,"DESC");
      pcVar6 = (char *)snd_device_name_get_hint(*plVar5,"IOID");
      if (__ptr_00 == (void *)0x0 || __ptr == (void *)0x0) {
        if (__ptr != (void *)0x0) goto LAB_00102679;
      }
      else {
        pcVar4 = "Input/Output";
        if (pcVar6 != (char *)0x0) {
          iVar2 = strcmp(pcVar6,"Input");
          pcVar4 = "Input";
          if (iVar2 != 0) goto LAB_00102679;
        }
        printf("%s\n%s: <%s>\n\n",__ptr_00,pcVar4,__ptr);
LAB_00102679:
        free(__ptr);
        free(__ptr_00);
        free(pcVar6);
      }
      lVar1 = plVar5[1];
      plVar5 = plVar5 + 1;
    } while( true );
  }
  printInDevices_cold_1();
  if (extraout_EDX == 1) {
    sVar3 = sendto(sock,pcVar4,(ulong)pcVar6 & 0xffffffff,0,(sockaddr *)addr->ai_addr,
                   addr->ai_addrlen);
    if (sVar3 == -1) {
LAB_001027be:
      abort();
    }
    if (debug_nmea == '\x01') {
      fputs(pcVar4,_stderr);
      return;
    }
  }
  else {
    uVar7 = buffer_count + (int)pcVar6;
    if (uVar7 < 0x800) {
      memcpy(buffer + buffer_count,pcVar4,(ulong)pcVar6 & 0xffffffff);
      if (uVar7 == 0 || (char)extraout_EDX != in_CL) {
        buffer_count = uVar7;
        return;
      }
      buffer_count = uVar7;
      sVar3 = sendto(sock,buffer,(ulong)uVar7,0,(sockaddr *)addr->ai_addr,addr->ai_addrlen);
      if (sVar3 == -1) goto LAB_001027be;
      if (debug_nmea == '\x01') {
        nmea_sentence_received_cold_1();
      }
    }
    buffer_count = 0;
  }
  return;
}

Assistant:

void printInDevices() {
    char **hints;
    /* Enumerate sound devices */
    int err = snd_device_name_hint(0, "pcm", (void***)&hints);
    if (err != 0) {
        fprintf(stderr, "Can't read data\n");
        exit(EXIT_FAILURE);
    }

    char** n = hints;
    while (*n != NULL) {
        char *name = snd_device_name_get_hint(*n, "NAME");
        char *desc = snd_device_name_get_hint(*n, "DESC");
        char *type = snd_device_name_get_hint(*n, "IOID");
        if (name != NULL && desc != NULL) {
            if (type == NULL || !strcmp(type, "Input")) {
                printf("%s\n%s: <%s>\n\n", desc, type == NULL ? "Input/Output" : "Input",name);
            }
        }
        if (name != NULL) free(name);
        if (name != NULL) free(desc);
        if (name != NULL) free(type);
        n++;
    }

    //Free hint buffer too
    snd_device_name_free_hint((void**)hints);
    snd_config_update_free_global();
}